

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mod.c
# Opt level: O0

void ppDivMod(word *b,word *divident,word *a,word *mod,size_t n,void *stack)

{
  bool_t bVar1;
  int iVar2;
  word *a_00;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *in_R9;
  word *da;
  word *da0;
  word *v;
  word *u;
  size_t nv;
  size_t nu;
  word *a_01;
  word *b_00;
  word *b_01;
  size_t local_38;
  
  b_01 = in_R9 + (long)in_R8;
  b_00 = b_01 + (long)in_R8;
  a_01 = b_00 + (long)in_R8;
  wwCopy(b_00,in_RSI,(size_t)in_R8);
  wwSetZero(a_01,(size_t)in_R8);
  wwCopy(in_R9,in_RDX,(size_t)in_R8);
  local_38 = wwWordSize(in_R9,(size_t)in_R8);
  wwCopy(b_01,in_RCX,(size_t)in_R8);
  a_00 = in_R8;
  while (bVar1 = wwIsZero(in_R9,local_38), bVar1 == 0) {
    while (bVar1 = wwTestBit(in_R9,0), bVar1 == 0) {
      bVar1 = wwTestBit(b_00,0);
      if (bVar1 == 0) {
        wwShLo(b_01,(size_t)b_00,(size_t)a_01);
      }
      else {
        wwXor2(b_00,in_RCX,(size_t)in_R8);
        wwShLo(b_01,(size_t)b_00,(size_t)a_01);
      }
      wwShLo(b_01,(size_t)b_00,(size_t)a_01);
    }
    while (bVar1 = wwTestBit(b_01,0), bVar1 == 0) {
      bVar1 = wwTestBit(a_01,0);
      if (bVar1 == 0) {
        wwShLo(b_01,(size_t)b_00,(size_t)a_01);
      }
      else {
        wwXor2(a_01,in_RCX,(size_t)in_R8);
        wwShLo(b_01,(size_t)b_00,(size_t)a_01);
      }
      wwShLo(b_01,(size_t)b_00,(size_t)a_01);
    }
    local_38 = wwWordSize(in_R9,local_38);
    a_00 = (word *)wwWordSize(b_01,(size_t)a_00);
    iVar2 = wwCmp2(a_00,(size_t)in_R9,b_01,(size_t)b_00);
    if (iVar2 < 0) {
      wwXor2(b_01,in_R9,local_38);
      wwXor2(a_01,b_00,(size_t)in_R8);
    }
    else {
      wwXor2(in_R9,b_01,(size_t)a_00);
      wwXor2(b_00,a_01,(size_t)in_R8);
    }
  }
  bVar1 = wwIsW(b_01,(size_t)a_00,1);
  if (bVar1 == 0) {
    wwSetZero(in_RDI,(size_t)in_R8);
  }
  else {
    wwCopy(in_RDI,a_01,(size_t)in_R8);
  }
  return;
}

Assistant:

void ppDivMod(word b[], const word divident[], const word a[],
	const word mod[], size_t n, void* stack)
{
	size_t nu, nv;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	word* da0 = v + n;
	word* da = da0 + n;
	stack = da + n;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwCmp(divident, mod, n) < 0);
	ASSERT(n > 0 && mod[n - 1] != 0 && wwTestBit(mod, 0));
	ASSERT(wwIsValid(b, n));
	// da0 <- divident, da <- 0
	wwCopy(da0, divident, n);
	wwSetZero(da, n);
	// u <- a, v <- mod
	wwCopy(u, a, n);
	nu = wwWordSize(u, n);
	wwCopy(v, mod, n);
	nv = n;
	// итерации со следующими инвариантами:
	//	da0 * a \equiv divident * u \mod mod
	//	da * a \equiv divident * v \mod mod
	while (!wwIsZero(u, nu))
	{
		// пока u делится на x
		for (; wwTestBit(u, 0) == 0; wwShLo(u, nu, 1))
			if (wwTestBit(da0, 0) == 0)
				// da0 <- da0 / x
				wwShLo(da0, n, 1);
			else
				// da0 <- (da0 + mod) / 2
				wwXor2(da0, mod, n), wwShLo(da0, n, 1);
		// пока v делится на x
		for (; wwTestBit(v, 0) == 0; wwShLo(v, nv, 1))
			if (wwTestBit(da, 0) == 0)
				// da <- da / x
				wwShLo(da, n, 1);
			else
				// da <- (da + mod) / 2
				wwXor2(da, mod, n), wwShLo(da, n, 1);
		// нормализация
		nu = wwWordSize(u, nu);
		nv = wwWordSize(v, nv);
		// u >= v?
		if (wwCmp2(u, nu, v, nv) >= 0)
		{
			// u <- u + v, da0 <- da0 + da
			wwXor2(u, v, nv);
			wwXor2(da0, da, n);
		}
		else
		{
			// v <- v + u, da <- da + da0
			wwXor2(v, u, nu);
			wwXor2(da, da0, n);
		}
	}
	// здесь v == \gcd(a, mod)
	EXPECT(wwIsW(v, nv, 1));
	// \gcd(a, mod) == 1 ? b <- da : b <- 0
	if (wwIsW(v, nv, 1))
		wwCopy(b, da, n);
	else
		wwSetZero(b, n);
}